

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall
QDataWidgetMapperPrivate::dataChanged
          (QDataWidgetMapperPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight,
          QList<int> *param_3)

{
  pointer pWVar1;
  bool bVar2;
  WidgetMapper *e;
  pointer m;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QModelIndex::parent(&local_50,topLeft);
  bVar2 = ::operator!=(&local_50,&this->rootIndex);
  if (!bVar2) {
    pWVar1 = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (m = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_start; m != pWVar1; m = m + 1) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,&m->currentIndex);
      if ((((topLeft->r <= local_50.r) && (local_50.r <= bottomRight->r)) &&
          (topLeft->c <= local_50.c)) && (local_50.c <= bottomRight->c)) {
        populate(this,m);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapperPrivate::dataChanged(const QModelIndex &topLeft,
                                           const QModelIndex &bottomRight, const QList<int> &)
{
    if (topLeft.parent() != rootIndex)
        return; // not in our hierarchy

    for (WidgetMapper &e : widgetMap) {
        if (qContainsIndex(e.currentIndex, topLeft, bottomRight))
            populate(e);
    }
}